

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

TreeEnsembleParameters_TreeNode *
google::protobuf::internal::
GenericTypeHandler<CoreML::Specification::TreeEnsembleParameters_TreeNode>::New(Arena *arena)

{
  Arena *arena_local;
  TreeEnsembleParameters_TreeNode *local_28;
  TreeEnsembleParameters_TreeNode *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (TreeEnsembleParameters_TreeNode *)operator_new(0x70);
    CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
              (local_28);
  }
  else {
    local_28 = (TreeEnsembleParameters_TreeNode *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::TreeEnsembleParameters_TreeNode::typeinfo,
                          0x70);
    CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
              (local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::TreeEnsembleParameters_TreeNode>
                      );
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }